

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O3

void __thiscall QCheckBox::checkStateSet(QCheckBox *this)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  uint local_4c;
  void *local_48;
  uint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar1 = *(byte *)(lVar2 + 0x2b4);
  *(byte *)(lVar2 + 0x2b4) = bVar1 & 0xfd;
  lVar3 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  uVar4 = 1;
  if ((~*(byte *)(lVar3 + 0x2b4) & 3) != 0) {
    uVar4 = *(byte *)(lVar3 + 0x28c) & 2;
  }
  if (uVar4 != (bVar1 >> 3 & 7)) {
    *(byte *)(lVar2 + 0x2b4) = bVar1 & 0xc5 | (char)uVar4 * '\b';
    local_48 = (void *)0x0;
    local_4c = uVar4;
    local_40 = &local_4c;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
    local_48 = (void *)0x0;
    local_4c = uVar4;
    local_40 = &local_4c;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCheckBox::checkStateSet()
{
    Q_D(QCheckBox);
    d->noChange = false;
    Qt::CheckState state = checkState();
    if (state != d->publishedState) {
        d->publishedState = state;
        emit checkStateChanged(state);
#if QT_DEPRECATED_SINCE(6, 9)
        QT_IGNORE_DEPRECATIONS(
        emit stateChanged(state);
        )
#endif
    }
}